

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O1

void subblock_test(void)

{
  btree_result bVar1;
  int iVar2;
  btree_kv_ops *pbVar3;
  filemgr_ops *pfVar4;
  filemgr *pfVar5;
  btree_blk_ops *pbVar6;
  size_t sVar7;
  long *extraout_RDX;
  uint uVar8;
  btree *btree_00;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong *key_buf;
  btreeblk_handle *handle;
  btree *unaff_R12;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  filemgr_open_result fVar17;
  ulong uStack_1478;
  ulong uStack_1470;
  btree_kv_ops *pbStack_1468;
  filemgr *pfStack_1460;
  undefined1 auStack_1458 [224];
  btree bStack_1378;
  timeval tStack_1340;
  filemgr_config fStack_1330;
  btree_kv_ops *pbStack_12c8;
  btree *pbStack_12c0;
  ulong local_1290;
  btree_meta meta;
  btree btree;
  btreeblk_handle bhandle;
  filemgr_config fconfig;
  timeval __test_begin;
  char keybuf [256];
  char valuebuf [256];
  char temp [256];
  btree btree_arr [64];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fconfig.flag = 0;
  fconfig.chunksize = 0;
  fconfig.prefetch_duration = 0;
  fconfig.encryption_key.bytes[0] = '\0';
  fconfig.encryption_key.bytes[1] = '\0';
  fconfig.encryption_key.bytes[2] = '\0';
  fconfig.encryption_key.bytes[3] = '\0';
  fconfig.encryption_key.bytes[4] = '\0';
  fconfig.encryption_key.bytes[5] = '\0';
  fconfig.encryption_key.bytes[6] = '\0';
  fconfig.encryption_key.bytes[7] = '\0';
  fconfig.encryption_key.bytes[8] = '\0';
  fconfig.encryption_key.bytes[9] = '\0';
  fconfig.encryption_key.bytes[10] = '\0';
  fconfig.encryption_key.bytes[0xb] = '\0';
  fconfig.encryption_key.bytes[0xc] = '\0';
  fconfig.encryption_key.bytes[0xd] = '\0';
  fconfig.encryption_key.bytes[0xe] = '\0';
  fconfig.encryption_key.bytes[0xf] = '\0';
  fconfig.encryption_key.bytes[0x10] = '\0';
  fconfig.encryption_key.bytes[0x11] = '\0';
  fconfig.encryption_key.bytes[0x12] = '\0';
  fconfig.encryption_key.bytes[0x13] = '\0';
  fconfig.encryption_key.bytes[0x14] = '\0';
  fconfig.encryption_key.bytes[0x15] = '\0';
  fconfig.encryption_key.bytes[0x16] = '\0';
  fconfig.encryption_key.bytes[0x17] = '\0';
  fconfig.encryption_key.bytes[0x18] = '\0';
  fconfig.encryption_key.bytes[0x19] = '\0';
  fconfig.encryption_key.bytes[0x1a] = '\0';
  fconfig.encryption_key.bytes[0x1b] = '\0';
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fconfig.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fconfig.do_not_cache_doc_blocks = false;
  fconfig._89_3_ = 0;
  fconfig.num_blocks_readahead = 0;
  fconfig.blocksize = 0x1000;
  fconfig.ncacheblock = 0;
  fconfig.options = '\b';
  fconfig.seqtree_opt = '\0';
  fconfig._18_6_ = 0;
  fconfig.num_wal_shards = 8;
  fconfig.num_bcache_shards = 0;
  fconfig.encryption_key.algorithm = 0;
  pbVar3 = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  system("rm -rf  btreeblock_testfile");
  pfVar4 = get_filemgr_ops();
  fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
  pfVar5 = fVar17.file;
  meta.data = malloc(0x1000);
  meta.size = 0x78;
  btreeblk_init(&bhandle,pfVar5,0x1000);
  pbVar6 = btreeblk_get_ops();
  pbStack_12c0 = (btree *)0x1055ae;
  btree_init(&btree,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
  if (btree.root_bid._6_1_ == 0) {
    subblock_test();
  }
  if ((btree.root_bid._6_1_ & 0xe0) == 0x40) {
    btreeblk_free(&bhandle);
    meta.size = 0xfa;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x105652;
    btree_init(unaff_R12,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
    if (btree.root_bid._6_1_ == 0) {
      subblock_test();
    }
    if ((btree.root_bid._6_1_ & 0xe0) != 0x60) goto LAB_001062b3;
    btreeblk_free(&bhandle);
    meta.size = 0x1fe;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x1056d9;
    btree_init(unaff_R12,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
    if (btree.root_bid._6_1_ == 0) {
      subblock_test();
    }
    if ((btree.root_bid._6_1_ & 0xe0) != 0x80) goto LAB_001062b8;
    btreeblk_free(&bhandle);
    meta.size = 0x3fc;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x105760;
    btree_init(unaff_R12,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
    if (btree.root_bid._6_1_ == 0) {
      subblock_test();
    }
    if ((btree.root_bid._6_1_ & 0xe0) != 0xa0) goto LAB_001062bd;
    btreeblk_free(&bhandle);
    meta.size = 0x7f8;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x1057e4;
    btree_init(unaff_R12,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
    if (btree.root_bid._6_1_ != 0) {
      subblock_test();
    }
    btreeblk_free(&bhandle);
    meta.size = 0xffa;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    pbStack_12c0 = (btree *)0x105850;
    bVar1 = btree_init(&btree,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,&meta);
    if (bVar1 == BTREE_RESULT_FAIL) {
      btreeblk_free(&bhandle);
      uVar13 = 1;
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      free(meta.data);
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      btreeblk_init(&bhandle,fVar17.file,0x1000);
      pbVar6 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x1058fd;
      btree_init(&btree,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar10 = 0;
      do {
        sprintf(keybuf,"%08d",uVar10);
        sprintf(valuebuf,"%08x",uVar10);
        btree_insert(&btree,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        uVar15 = 0;
        do {
          sprintf(keybuf,"%08d",uVar15);
          sprintf(valuebuf,"%08x",uVar15);
          btree_find(&btree,keybuf,temp);
          btreeblk_end(&bhandle);
          sVar7 = strlen(valuebuf);
          iVar2 = bcmp(valuebuf,temp,sVar7);
          if (iVar2 != 0) {
            subblock_test();
          }
          uVar8 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar8;
        } while (uVar13 != uVar8);
        uVar8 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar8;
        uVar13 = uVar13 + 1;
      } while (uVar8 != 0x100);
      btreeblk_free(&bhandle);
      uVar13 = 1;
      filemgr_close(fVar17.file,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      pfVar5 = fVar17.file;
      btreeblk_init(&bhandle,pfVar5,0x1000);
      pbVar6 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x105a7f;
      btree_init(&btree,&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar10 = 0;
      do {
        sprintf(keybuf,"%08d",uVar10);
        sprintf(valuebuf,"%08x",uVar10);
        btree_insert(&btree,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
        uVar15 = 0;
        do {
          sprintf(keybuf,"%08d",uVar15);
          sprintf(valuebuf,"%08x",uVar15);
          btree_find(&btree,keybuf,temp);
          btreeblk_end(&bhandle);
          sVar7 = strlen(valuebuf);
          iVar2 = bcmp(valuebuf,temp,sVar7);
          if (iVar2 != 0) {
            subblock_test();
          }
          uVar8 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar8;
        } while (uVar13 != uVar8);
        uVar8 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar8;
        uVar13 = uVar13 + 1;
      } while (uVar8 != 0x100);
      btreeblk_free(&bhandle);
      lVar14 = 0;
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      btreeblk_init(&bhandle,fVar17.file,0x1000);
      do {
        pbVar6 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x105c1b;
        btree_init((btree *)(&btree_arr[0].ksize + lVar14),&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar14 = lVar14 + 0x38;
      } while (lVar14 == 0x38);
      local_1290._0_4_ = 1;
      uVar13 = 0;
      do {
        uVar10 = 0;
        do {
          uVar15 = 0;
          sprintf(keybuf,"%02d%06d",uVar10 & 0xffffffff,(ulong)uVar13);
          sprintf(valuebuf,"%02d%06x",uVar10 & 0xffffffff,(ulong)uVar13);
          btree_insert(btree_arr + uVar10,keybuf,valuebuf);
          btreeblk_end(&bhandle);
          do {
            sprintf(keybuf,"%02d%06d",uVar10 & 0xffffffff,uVar15);
            sprintf(valuebuf,"%02d%06x",uVar10 & 0xffffffff);
            btree_find(btree_arr + uVar10,keybuf,temp);
            btreeblk_end(&bhandle);
            sVar7 = strlen(valuebuf);
            iVar2 = bcmp(valuebuf,temp,sVar7);
            if (iVar2 != 0) {
              subblock_test();
            }
            uVar8 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar8;
          } while ((uint)local_1290 != uVar8);
          bVar16 = uVar10 == 0;
          uVar10 = uVar10 + 1;
        } while (bVar16);
        uVar13 = uVar13 + 1;
        local_1290._0_4_ = (uint)local_1290 + 1;
      } while (uVar13 != 0x100);
      btreeblk_free(&bhandle);
      lVar14 = 0;
      filemgr_close(fVar17.file,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      pfVar5 = fVar17.file;
      btreeblk_init(&bhandle,pfVar5,0x1000);
      do {
        pbVar6 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x105dee;
        btree_init((btree *)(&btree_arr[0].ksize + lVar14),&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar14 = lVar14 + 0x38;
      } while (lVar14 == 0x38);
      uVar13 = 1;
      uVar10 = 0;
      do {
        btree_00 = btree_arr;
        uVar15 = 0;
        do {
          sprintf(keybuf,"%02d%06d",uVar15 & 0xffffffff,uVar10);
          sprintf(valuebuf,"%02d%06x",uVar15 & 0xffffffff,uVar10);
          btree_insert(btree_00,keybuf,valuebuf);
          btreeblk_end(&bhandle);
          uVar15 = uVar15 + 1;
          btree_00 = btree_00 + 1;
        } while (uVar15 == 1);
        filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
        uVar15 = 0;
        do {
          uVar9 = 0;
          do {
            sprintf(keybuf,"%02d%06d",uVar15 & 0xffffffff,uVar9);
            sprintf(valuebuf,"%02d%06x",uVar15 & 0xffffffff,uVar9);
            btree_find(btree_arr + uVar15,keybuf,temp);
            btreeblk_end(&bhandle);
            sVar7 = strlen(valuebuf);
            iVar2 = bcmp(valuebuf,temp,sVar7);
            if (iVar2 != 0) {
              subblock_test();
            }
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
          } while (uVar13 != uVar8);
          bVar16 = uVar15 == 0;
          uVar15 = uVar15 + 1;
        } while (bVar16);
        uVar8 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar8;
        uVar13 = uVar13 + 1;
      } while (uVar8 != 0x100);
      btreeblk_free(&bhandle);
      lVar14 = 0;
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      pfVar5 = fVar17.file;
      btreeblk_init(&bhandle,pfVar5,0x1000);
      do {
        pbVar6 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x106001;
        btree_init((btree *)(&btree_arr[0].ksize + lVar14),&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar14 = lVar14 + 0x38;
      } while (lVar14 != 0x188);
      uVar10 = 0;
      do {
        uVar13 = (0x80 << ((byte)uVar10 & 0x1f)) + -0x10 >> 4;
        if (0 < (int)uVar13) {
          uVar15 = 0;
          do {
            sprintf(keybuf,"%02d%06d",uVar10 & 0xffffffff,uVar15);
            sprintf(valuebuf,"%02d%06x",uVar10 & 0xffffffff);
            btree_insert(btree_arr + uVar10,keybuf,valuebuf);
            btreeblk_end(&bhandle);
            uVar8 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar8;
          } while (uVar13 != uVar8);
        }
        filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 7);
      btreeblk_free(&bhandle);
      lVar14 = 0;
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fconfig,(err_log_callback *)0x0);
      pfVar5 = fVar17.file;
      btreeblk_init(&bhandle,pfVar5,0x1000);
      do {
        pbVar6 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x10615e;
        btree_init((btree *)(&btree_arr[0].ksize + lVar14),&bhandle,pbVar6,pbVar3,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar14 = lVar14 + 0x38;
      } while (lVar14 != 0x188);
      local_1290 = 0;
      do {
        uVar13 = (0x80 << ((byte)local_1290 & 0x1f)) + -0x10 >> 4;
        if (0 < (int)uVar13) {
          uVar8 = 0;
          do {
            sprintf(keybuf,"%02d%06d",local_1290 & 0xffffffff,(ulong)uVar8);
            sprintf(valuebuf,"%02d%06x",local_1290 & 0xffffffff,(ulong)uVar8);
            btree_insert(btree_arr + local_1290,keybuf,valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
        }
        local_1290 = local_1290 + 1;
      } while (local_1290 != 7);
      btreeblk_free(&bhandle);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      free(pbVar3);
      pcVar11 = "%s PASSED\n";
      if (subblock_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar11,"subblock test");
      return;
    }
  }
  else {
    subblock_test();
LAB_001062b3:
    subblock_test();
LAB_001062b8:
    subblock_test();
LAB_001062bd:
    pbVar3 = (btree_kv_ops *)&bhandle;
    subblock_test();
  }
  subblock_test();
  pbStack_12c8 = pbVar3;
  pbStack_12c0 = unaff_R12;
  gettimeofday(&tStack_1340,(__timezone_ptr_t)0x0);
  system("rm -rf  btreeblock_testfile");
  memleak_start();
  fStack_1330.flag = 0;
  fStack_1330.chunksize = 0;
  fStack_1330.prefetch_duration = 0;
  fStack_1330.encryption_key.bytes[0] = '\0';
  fStack_1330.encryption_key.bytes[1] = '\0';
  fStack_1330.encryption_key.bytes[2] = '\0';
  fStack_1330.encryption_key.bytes[3] = '\0';
  fStack_1330.encryption_key.bytes[4] = '\0';
  fStack_1330.encryption_key.bytes[5] = '\0';
  fStack_1330.encryption_key.bytes[6] = '\0';
  fStack_1330.encryption_key.bytes[7] = '\0';
  fStack_1330.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1330.do_not_cache_doc_blocks = false;
  fStack_1330._89_3_ = 0;
  fStack_1330.num_blocks_readahead = 0;
  fStack_1330.encryption_key.bytes[0x18] = '\0';
  fStack_1330.encryption_key.bytes[0x19] = '\0';
  fStack_1330.encryption_key.bytes[0x1a] = '\0';
  fStack_1330.encryption_key.bytes[0x1b] = '\0';
  fStack_1330.encryption_key.bytes[0x1c] = '\0';
  fStack_1330.encryption_key.bytes[0x1d] = '\0';
  fStack_1330.encryption_key.bytes[0x1e] = '\0';
  fStack_1330.encryption_key.bytes[0x1f] = '\0';
  fStack_1330.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1330.encryption_key.bytes[8] = '\0';
  fStack_1330.encryption_key.bytes[9] = '\0';
  fStack_1330.encryption_key.bytes[10] = '\0';
  fStack_1330.encryption_key.bytes[0xb] = '\0';
  fStack_1330.encryption_key.bytes[0xc] = '\0';
  fStack_1330.encryption_key.bytes[0xd] = '\0';
  fStack_1330.encryption_key.bytes[0xe] = '\0';
  fStack_1330.encryption_key.bytes[0xf] = '\0';
  fStack_1330.encryption_key.bytes[0x10] = '\0';
  fStack_1330.encryption_key.bytes[0x11] = '\0';
  fStack_1330.encryption_key.bytes[0x12] = '\0';
  fStack_1330.encryption_key.bytes[0x13] = '\0';
  fStack_1330.encryption_key.bytes[0x14] = '\0';
  fStack_1330.encryption_key.bytes[0x15] = '\0';
  fStack_1330.encryption_key.bytes[0x16] = '\0';
  fStack_1330.encryption_key.bytes[0x17] = '\0';
  fStack_1330.blocksize = 0x100;
  fStack_1330.ncacheblock = 0;
  fStack_1330.options = '\b';
  fStack_1330.seqtree_opt = '\0';
  fStack_1330._18_6_ = 0;
  fStack_1330.num_wal_shards = 8;
  fStack_1330.num_bcache_shards = 0;
  fStack_1330.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar17 = filemgr_open("./btreeblock_testfile",pfVar4,&fStack_1330,(err_log_callback *)0x0);
  pfStack_1460 = fVar17.file;
  btreeblk_init((btreeblk_handle *)(auStack_1458 + 0x68),pfStack_1460,0x100);
  pbVar3 = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pbVar6 = btreeblk_get_ops();
  pbStack_1468 = pbVar3;
  btree_init(&bStack_1378,(btreeblk_handle *)(auStack_1458 + 0x68),pbVar6,pbVar3,0x100,'\b','\b',0,
             (btree_meta *)0x0);
  lVar12 = 0x1e;
  lVar14 = -0x6000000000000000;
  uVar15 = 0xa00000000000;
  uVar10 = 0xa000000000000;
  do {
    uStack_1470 = (uVar15 & 0xffff000000000000) + lVar14;
    uStack_1478 = uVar10;
    btree_insert(&bStack_1378,&uStack_1470,&uStack_1478);
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    lVar14 = lVar14 + 0x1000000000000000;
    uVar15 = uVar15 + 0x100000000000;
    uVar10 = uVar10 + 0x1000000000000;
    lVar12 = lVar12 + -1;
  } while (lVar12 != 0);
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
  key_buf = &uStack_1470;
  bVar1 = btree_next((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
  if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b4a;
  uVar15 = 0xa0;
  uVar10 = 0xa00;
  lVar14 = 0x1e;
  do {
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                  (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                  (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                  (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
    uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                  (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                  (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                  (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
    if (uVar15 != uStack_1470) {
      btree_reverse_iterator_test();
    }
    if (uVar10 != uStack_1478) {
      btree_reverse_iterator_test();
    }
    key_buf = &uStack_1470;
    bVar1 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    uVar15 = uVar15 + 0x10;
    uVar10 = uVar10 + 0x100;
    lVar14 = lVar14 + -1;
  } while (bVar1 == BTREE_RESULT_SUCCESS);
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
  if (lVar14 != 0) goto LAB_00106b61;
  uStack_1470 = 0x1027000000000000;
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,&uStack_1470);
  bVar1 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
  if (bVar1 == BTREE_RESULT_SUCCESS) {
    do {
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      bVar1 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    } while (bVar1 == BTREE_RESULT_SUCCESS);
  }
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
  bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
  if (bVar1 == BTREE_RESULT_SUCCESS) {
    do {
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    } while (bVar1 == BTREE_RESULT_SUCCESS);
  }
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
  key_buf = &uStack_1470;
  uStack_1470 = 0x1027000000000000;
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,key_buf);
  bVar1 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
  if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b66;
  uVar15 = 0x270;
  uVar10 = 0x2700;
  lVar14 = 0x1e;
  do {
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                  (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                  (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                  (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
    uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                  (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                  (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                  (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
    if (uVar15 != uStack_1470) {
      btree_reverse_iterator_test();
    }
    if (uVar10 != uStack_1478) {
      btree_reverse_iterator_test();
    }
    key_buf = &uStack_1470;
    bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    uVar15 = uVar15 - 0x10;
    uVar10 = uVar10 - 0x100;
    lVar14 = lVar14 + -1;
  } while (bVar1 == BTREE_RESULT_SUCCESS);
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
  if (lVar14 != 0) goto LAB_00106b7d;
  key_buf = &uStack_1470;
  uStack_1470 = 0x7501000000000000;
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,key_buf);
  bVar1 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
  if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b82;
  uVar15 = 0x170;
  uVar10 = 0x1700;
  lVar14 = 0xe;
  do {
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                  (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                  (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                  (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
    uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                  (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                  (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                  (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
    if (uVar15 != uStack_1470) {
      btree_reverse_iterator_test();
    }
    if (uVar10 != uStack_1478) {
      btree_reverse_iterator_test();
    }
    key_buf = &uStack_1470;
    bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    uVar15 = uVar15 - 0x10;
    uVar10 = uVar10 - 0x100;
    lVar14 = lVar14 + -1;
  } while (bVar1 == BTREE_RESULT_SUCCESS);
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  handle = (btreeblk_handle *)auStack_1458;
  btree_iterator_free((btree_iterator *)handle);
  if (lVar14 == 0) {
    btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
    uVar10 = 0xa0;
    uVar15 = 0xa00;
    do {
      key_buf = &uStack_1470;
      bVar1 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      if (bVar1 != BTREE_RESULT_SUCCESS) {
        btree_reverse_iterator_test();
        goto LAB_00106b3b;
      }
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar10 != uStack_1470) {
        btree_reverse_iterator_test();
      }
      if (uVar15 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      uVar10 = uVar10 + 0x10;
      uVar15 = uVar15 + 0x100;
    } while (uVar10 != 400);
    uVar15 = 0x170;
    uVar10 = 0x1700;
    do {
      key_buf = &uStack_1470;
      bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b3b;
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar15 != uStack_1470) {
        btree_reverse_iterator_test();
      }
      if (uVar10 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      uVar15 = uVar15 - 0x10;
      uVar10 = uVar10 - 0x100;
    } while (uVar15 != 0x100);
    uVar15 = 0x120;
    uVar10 = 0x1200;
    do {
      key_buf = &uStack_1470;
      bVar1 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b40;
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar15 != uStack_1470) {
        btree_reverse_iterator_test();
      }
      if (uVar10 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      uVar15 = uVar15 + 0x10;
      uVar10 = uVar10 + 0x100;
    } while (uVar15 != 0x1c0);
    uVar15 = 0x1a0;
    uVar10 = 0x1a00;
    do {
      key_buf = &uStack_1470;
      bVar1 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b45;
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar15 != uStack_1470) {
        btree_reverse_iterator_test();
      }
      if (uVar10 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      uVar15 = uVar15 - 0x10;
      uVar10 = uVar10 - 0x100;
    } while (uVar15 != 0x90);
    key_buf = &uStack_1470;
    bVar1 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
    handle = (btreeblk_handle *)(auStack_1458 + 0x68);
    btreeblk_end(handle);
    if (bVar1 == BTREE_RESULT_FAIL) {
      btree_iterator_free((btree_iterator *)auStack_1458);
      free(pbStack_1468);
      btreeblk_free((btreeblk_handle *)(auStack_1458 + 0x68));
      filemgr_close(pfStack_1460,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (btree_reverse_iterator_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar11,"btree reverse iterator test");
      return;
    }
    goto LAB_00106b9e;
  }
  goto LAB_00106b99;
LAB_00106b3b:
  btree_reverse_iterator_test();
LAB_00106b40:
  btree_reverse_iterator_test();
LAB_00106b45:
  btree_reverse_iterator_test();
LAB_00106b4a:
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
LAB_00106b61:
  btree_reverse_iterator_test();
LAB_00106b66:
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  btree_iterator_free((btree_iterator *)auStack_1458);
LAB_00106b7d:
  btree_reverse_iterator_test();
LAB_00106b82:
  btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
  handle = (btreeblk_handle *)auStack_1458;
  btree_iterator_free((btree_iterator *)handle);
LAB_00106b99:
  btree_reverse_iterator_test();
LAB_00106b9e:
  btree_reverse_iterator_test();
  sprintf(load_test_next_kv::kk,"k%07lu",*extraout_RDX);
  sprintf(load_test_next_kv::vv,"v%07lu",*extraout_RDX);
  *extraout_RDX = *extraout_RDX + 1;
  *(char **)handle = load_test_next_kv::kk;
  *key_buf = (ulong)load_test_next_kv::vv;
  return;
}

Assistant:

void subblock_test()
{
    TEST_INIT();

    int i, j, k, r, nbtrees;
    int nodesize;
    int blocksize = 4096;
    char *fname = (char *) "./btreeblock_testfile";
    char keybuf[256], valuebuf[256], temp[256];
    filemgr_open_result result;
    btree_result br;
    bid_t bid;
    size_t subblock_no, idx;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree_kv_ops *ops;
    struct btree btree, btree_arr[64];
    struct filemgr_config fconfig;
    struct btree_meta meta;

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;
    ops = btree_kv_get_kb64_vb64(NULL);

    // btree initialization using large metadata test
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    meta.data = (void*)malloc(4096);

    meta.size = 120;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 1);
    btreeblk_free(&bhandle);

    meta.size = 250;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 2);
    btreeblk_free(&bhandle);

    meta.size = 510;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 3);
    btreeblk_free(&bhandle);

    meta.size = 1020;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 4);
    btreeblk_free(&bhandle);

    meta.size = 2040;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(!is_subblock(btree.root_bid));
    btreeblk_free(&bhandle);

    meta.size = 4090;
    btreeblk_init(&bhandle, file, blocksize);
    br = btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(meta.data);

    // coverage: enlarge case 1-1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, move case 1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(file, true, NULL);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 2-2, 3-1
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, 2-1, 3-1, move case 1, 2-1, 2-2
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
        for (j=0;j<nbtrees;++j){
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 1-2, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(file, true, NULL);
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    free(ops);
    TEST_RESULT("subblock test");
}